

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O0

ExpressionValue *
expLabelFuncDefined(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
                   vector<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_>
                   *parameters)

{
  bool bVar1;
  __shared_ptr *this;
  __shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  vector<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_> *parameters_local;
  Identifier *funcName_local;
  
  bVar1 = std::vector<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_>::empty
                    (parameters);
  if (!bVar1) {
    this = (__shared_ptr *)
           std::vector<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_>::front
                     (parameters);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(this);
    if (bVar1) {
      this_00 = (__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_>::front
                          (parameters);
      this_01 = std::__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(this_00);
      bVar1 = Label::isDefined(this_01);
      ExpressionValue::ExpressionValue(__return_storage_ptr__,(ulong)bVar1);
      return __return_storage_ptr__;
    }
  }
  Logger::queueError<Identifier>
            ((Logger *)0x1,0x22083e,(char *)funcName,
             (Identifier *)CONCAT71(in_register_00000009,in_CL));
  ExpressionValue::ExpressionValue(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expLabelFuncDefined(const Identifier &funcName, const std::vector<std::shared_ptr<Label>> &parameters)
{
	if (parameters.empty() || !parameters.front())
	{
		Logger::queueError(Logger::Error, "%s: Invalid parameters", funcName);
		return ExpressionValue();
	}

	return ExpressionValue(parameters.front()->isDefined() ? INT64_C(1) : INT64_C(0));
}